

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O1

cs_insn * cs_malloc(csh ud)

{
  cs_insn *pcVar1;
  cs_detail *pcVar2;
  
  pcVar1 = (cs_insn *)(*cs_mem_malloc)(0xf0);
  if (pcVar1 != (cs_insn *)0x0) {
    if (*(int *)(ud + 0xe0) == 0) {
      pcVar1->detail = (cs_detail *)0x0;
      return pcVar1;
    }
    pcVar2 = (cs_detail *)(*cs_mem_malloc)(0x5f8);
    pcVar1->detail = pcVar2;
    if (pcVar2 != (cs_detail *)0x0) {
      return pcVar1;
    }
    (*cs_mem_free)(pcVar1);
  }
  *(undefined4 *)(ud + 0x58) = 1;
  return (cs_insn *)0x0;
}

Assistant:

CAPSTONE_EXPORT
cs_insn *cs_malloc(csh ud)
{
	cs_insn *insn;
	struct cs_struct *handle = (struct cs_struct *)(uintptr_t)ud;

	insn = cs_mem_malloc(sizeof(cs_insn));
	if (!insn) {
		// insufficient memory
		handle->errnum = CS_ERR_MEM;
		return NULL;
	} else {
		if (handle->detail) {
			// allocate memory for @detail pointer
			insn->detail = cs_mem_malloc(sizeof(cs_detail));
			if (insn->detail == NULL) {	// insufficient memory
				cs_mem_free(insn);
				handle->errnum = CS_ERR_MEM;
				return NULL;
			}
		} else
			insn->detail = NULL;
	}

	return insn;
}